

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

int secp256k1_scalar_add(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar3;
  
  uVar1 = b->d[0];
  uVar7 = a->d[0];
  uVar4 = uVar1 + a->d[0];
  r->d[0] = uVar4;
  uVar1 = (ulong)CARRY8(uVar1,uVar7);
  uVar7 = a->d[1] + uVar1;
  uVar9 = (ulong)CARRY8(a->d[1],uVar1);
  uVar1 = b->d[1];
  uVar8 = uVar7 + b->d[1];
  r->d[1] = uVar8;
  uVar1 = (ulong)CARRY8(uVar7,uVar1);
  uVar7 = uVar9 + a->d[2];
  uVar10 = uVar7 + uVar1;
  uVar3 = (ulong)(CARRY8(uVar9,a->d[2]) || CARRY8(uVar7,uVar1));
  uVar1 = b->d[2];
  uVar11 = uVar10 + b->d[2];
  r->d[2] = uVar11;
  uVar7 = (ulong)CARRY8(uVar10,uVar1);
  uVar9 = uVar3 + a->d[3];
  uVar10 = uVar9 + uVar7;
  uVar1 = b->d[3];
  bVar12 = uVar10 + uVar1 == -1;
  bVar5 = (0xbaaedce6af48a03a < uVar8 && 0xfffffffffffffffd < uVar11) && bVar12;
  uVar2 = 0;
  if (0xbaaedce6af48a03b < uVar8) {
    uVar2 = (uint)bVar5;
  }
  uVar6 = 0;
  if (0xbfd25e8cd0364140 < uVar4) {
    uVar6 = (uint)bVar5;
  }
  uVar2 = (uint)(CARRY8(uVar3,a->d[3]) || CARRY8(uVar9,uVar7)) +
          (uVar6 | uVar2 | (uVar11 == 0xffffffffffffffff && bVar12)) + (uint)CARRY8(uVar10,uVar1);
  uVar3 = (ulong)uVar2;
  r->d[0] = uVar3 * 0x402da1732fc9bebf + uVar4;
  uVar7 = (ulong)CARRY8(uVar3 * 0x402da1732fc9bebf,uVar4);
  uVar9 = uVar3 * 0x4551231950b75fc4 + uVar8;
  r->d[1] = uVar9 + uVar7;
  uVar7 = (ulong)(CARRY8(uVar3 * 0x4551231950b75fc4,uVar8) || CARRY8(uVar9,uVar7));
  r->d[2] = uVar11 + uVar3 + uVar7;
  r->d[3] = uVar10 + uVar1 + (ulong)(CARRY8(uVar11,uVar3) || CARRY8(uVar11 + uVar3,uVar7));
  return uVar2;
}

Assistant:

static int secp256k1_scalar_add(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    int overflow;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);

    secp256k1_u128_from_u64(&t, a->d[0]);
    secp256k1_u128_accum_u64(&t, b->d[0]);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[1]);
    secp256k1_u128_accum_u64(&t, b->d[1]);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[2]);
    secp256k1_u128_accum_u64(&t, b->d[2]);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[3]);
    secp256k1_u128_accum_u64(&t, b->d[3]);
    r->d[3] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    overflow = secp256k1_u128_to_u64(&t) + secp256k1_scalar_check_overflow(r);
    VERIFY_CHECK(overflow == 0 || overflow == 1);
    secp256k1_scalar_reduce(r, overflow);

    SECP256K1_SCALAR_VERIFY(r);
    return overflow;
}